

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::TransformFeedback::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 *puVar8;
  char *description;
  bool bVar9;
  int *piVar10;
  qpTestResult testResult;
  TestContext *this_00;
  int *piVar11;
  GLuint xfb_legacy [2];
  GLuint xfb_dsa [2];
  GLint xfb_binding_point;
  int local_1c8 [5];
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_1c8[2] = 0;
    local_1c8[3] = 0;
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    (**(code **)(lVar7 + 0xd0))(0x8e22,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindTransformFeedback have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x65);
    piVar10 = local_1c8;
    (**(code **)(lVar7 + 0x700))(2,piVar10);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x69);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar3 = true;
    bVar2 = true;
    do {
      bVar9 = bVar2;
      cVar4 = (**(code **)(lVar7 + 0xcd0))(*piVar10);
      if (cVar4 != '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GenTransformFeedbacks has created defualt objects, but only shall reserve names for them."
                   ,0x59);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      piVar10 = local_1c8 + 1;
      bVar2 = false;
    } while (bVar9);
    piVar10 = local_1c8 + 2;
    (**(code **)(lVar7 + 0x408))(2,piVar10);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x7b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar2 = true;
    do {
      bVar9 = bVar2;
      cVar4 = (**(code **)(lVar7 + 0xcd0))(*piVar10);
      if (cVar4 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"CreateTransformFeedbacks has not created defualt objects.",
                   0x39);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      piVar10 = local_1c8 + 3;
      bVar2 = false;
    } while (bVar9);
    local_1b4 = -1;
    (**(code **)(lVar7 + 0x868))(0x8e25);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x8e);
    if (local_1b4 != 0) {
      if (local_1b4 == -1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetIntegerv used with GL_TRANSFORM_FEEDBACK_BINDING have not returned anything and did not generate error."
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar8 = 0;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "The usage of glCreateTransformFeedbacks have changed GL_TRANSFORM_FEEDBACK_BINDING binding point."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
    piVar10 = local_1c8 + 2;
    piVar11 = local_1c8;
    bVar2 = true;
    do {
      bVar9 = bVar2;
      if (*piVar11 != 0) {
        (**(code **)(lVar7 + 0x488))(1);
        *piVar11 = 0;
      }
      if (*piVar10 != 0) {
        (**(code **)(lVar7 + 0x488))(1);
        *piVar10 = 0;
      }
      piVar11 = local_1c8 + 1;
      piVar10 = local_1c8 + 3;
      bVar2 = false;
    } while (bVar9);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Transform feedback objects */
	static const glw::GLuint xfb_count = 2;

	glw::GLuint xfb_dsa[xfb_count]	= {};
	glw::GLuint xfb_legacy[xfb_count] = {};

	try
	{
		/* Sanity default setup. */
		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback have failed");

		/* Check legacy way. */
		gl.genTransformFeedbacks(xfb_count, xfb_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks have failed");

		for (glw::GLuint i = 0; i < xfb_count; ++i)
		{
			if (gl.isTransformFeedback(xfb_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenTransformFeedbacks has created defualt objects, but only shall reserve names for them."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state access way. */
		gl.createTransformFeedbacks(xfb_count, xfb_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

		for (glw::GLuint i = 0; i < xfb_count; ++i)
		{
			if (!gl.isTransformFeedback(xfb_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateTransformFeedbacks has not created defualt objects."
													<< tcu::TestLog::EndMessage;
			}
		}

		/* Check binding point. */
		glw::GLint xfb_binding_point = -1;

		gl.getIntegerv(GL_TRANSFORM_FEEDBACK_BINDING, &xfb_binding_point);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

		if (0 != xfb_binding_point)
		{
			if (-1 == xfb_binding_point)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "glGetIntegerv used with GL_TRANSFORM_FEEDBACK_BINDING have not "
													   "returned anything and did not generate error."
													<< tcu::TestLog::EndMessage;

				throw 0;
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "The usage of glCreateTransformFeedbacks have changed "
													   "GL_TRANSFORM_FEEDBACK_BINDING binding point."
													<< tcu::TestLog::EndMessage;

				is_ok = false;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < xfb_count; ++i)
	{
		if (xfb_legacy[i])
		{
			gl.deleteTransformFeedbacks(1, &xfb_legacy[i]);

			xfb_legacy[i] = 0;
		}

		if (xfb_dsa[i])
		{
			gl.deleteTransformFeedbacks(1, &xfb_dsa[i]);

			xfb_dsa[i] = 0;
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}